

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::RasterizationTests::init(RasterizationTests *this,EVP_PKEY_CTX *ctx)

{
  Context *ctx_00;
  int extraout_EAX;
  TestNode *pTVar1;
  TestNode *pTVar2;
  PointCase *this_00;
  FillRuleCase *pFVar3;
  CullingTest *this_01;
  char *pcVar4;
  TriangleInterpolationTest *pTVar5;
  LineInterpolationTest *pLVar6;
  TestCaseGroup *projected;
  TestCaseGroup *basic;
  TestCaseGroup *interpolation;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string name;
  int local_40;
  int frontOrderNdx;
  int primitiveNdx;
  int cullModeNdx;
  TestCaseGroup *culling;
  TestCaseGroup *fillRules;
  TestCaseGroup *primitives;
  RasterizationTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"primitives",
             "Primitive rasterization");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar2 = (TestNode *)operator_new(0xa8);
  anon_unknown_1::TrianglesCase::TrianglesCase
            ((TrianglesCase *)pTVar2,(this->super_TestCaseGroup).m_context,"triangles",
             "Render primitives as GL_TRIANGLES, verify rasterization result");
  tcu::TestNode::addChild(pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xa8);
  anon_unknown_1::TriangleStripCase::TriangleStripCase
            ((TriangleStripCase *)pTVar2,(this->super_TestCaseGroup).m_context,"triangle_strip",
             "Render primitives as GL_TRIANGLE_STRIP, verify rasterization result");
  tcu::TestNode::addChild(pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xa8);
  anon_unknown_1::TriangleFanCase::TriangleFanCase
            ((TriangleFanCase *)pTVar2,(this->super_TestCaseGroup).m_context,"triangle_fan",
             "Render primitives as GL_TRIANGLE_FAN, verify rasterization result");
  tcu::TestNode::addChild(pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xb0);
  anon_unknown_1::LinesCase::LinesCase
            ((LinesCase *)pTVar2,(this->super_TestCaseGroup).m_context,"lines",
             "Render primitives as GL_LINES, verify rasterization result",PRIMITIVEWIDENESS_NARROW);
  tcu::TestNode::addChild(pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xb0);
  anon_unknown_1::LineStripCase::LineStripCase
            ((LineStripCase *)pTVar2,(this->super_TestCaseGroup).m_context,"line_strip",
             "Render primitives as GL_LINE_STRIP, verify rasterization result",
             PRIMITIVEWIDENESS_NARROW);
  tcu::TestNode::addChild(pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xb0);
  anon_unknown_1::LineLoopCase::LineLoopCase
            ((LineLoopCase *)pTVar2,(this->super_TestCaseGroup).m_context,"line_loop",
             "Render primitives as GL_LINE_LOOP, verify rasterization result",
             PRIMITIVEWIDENESS_NARROW);
  tcu::TestNode::addChild(pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xb0);
  anon_unknown_1::LinesCase::LinesCase
            ((LinesCase *)pTVar2,(this->super_TestCaseGroup).m_context,"lines_wide",
             "Render primitives as GL_LINES with wide lines, verify rasterization result",
             PRIMITIVEWIDENESS_WIDE);
  tcu::TestNode::addChild(pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xb0);
  anon_unknown_1::LineStripCase::LineStripCase
            ((LineStripCase *)pTVar2,(this->super_TestCaseGroup).m_context,"line_strip_wide",
             "Render primitives as GL_LINE_STRIP with wide lines, verify rasterization result",
             PRIMITIVEWIDENESS_WIDE);
  tcu::TestNode::addChild(pTVar1,pTVar2);
  pTVar2 = (TestNode *)operator_new(0xb0);
  anon_unknown_1::LineLoopCase::LineLoopCase
            ((LineLoopCase *)pTVar2,(this->super_TestCaseGroup).m_context,"line_loop_wide",
             "Render primitives as GL_LINE_LOOP with wide lines, verify rasterization result",
             PRIMITIVEWIDENESS_WIDE);
  tcu::TestNode::addChild(pTVar1,pTVar2);
  this_00 = (PointCase *)operator_new(0xa8);
  anon_unknown_1::PointCase::PointCase
            (this_00,(this->super_TestCaseGroup).m_context,"points",
             "Render primitives as GL_POINTS, verify rasterization result",PRIMITIVEWIDENESS_WIDE);
  tcu::TestNode::addChild(pTVar1,(TestNode *)this_00);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fill_rules",
             "Primitive fill rules");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pFVar3 = (FillRuleCase *)operator_new(0xa8);
  anon_unknown_1::FillRuleCase::FillRuleCase
            (pFVar3,(this->super_TestCaseGroup).m_context,"basic_quad","Verify fill rules",
             FILLRULECASE_BASIC);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pFVar3);
  pFVar3 = (FillRuleCase *)operator_new(0xa8);
  anon_unknown_1::FillRuleCase::FillRuleCase
            (pFVar3,(this->super_TestCaseGroup).m_context,"basic_quad_reverse","Verify fill rules",
             FILLRULECASE_REVERSED);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pFVar3);
  pFVar3 = (FillRuleCase *)operator_new(0xa8);
  anon_unknown_1::FillRuleCase::FillRuleCase
            (pFVar3,(this->super_TestCaseGroup).m_context,"clipped_full","Verify fill rules",
             FILLRULECASE_CLIPPED_FULL);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pFVar3);
  pFVar3 = (FillRuleCase *)operator_new(0xa8);
  anon_unknown_1::FillRuleCase::FillRuleCase
            (pFVar3,(this->super_TestCaseGroup).m_context,"clipped_partly","Verify fill rules",
             FILLRULECASE_CLIPPED_PARTIAL);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pFVar3);
  pFVar3 = (FillRuleCase *)operator_new(0xa8);
  anon_unknown_1::FillRuleCase::FillRuleCase
            (pFVar3,(this->super_TestCaseGroup).m_context,"projected","Verify fill rules",
             FILLRULECASE_PROJECTED);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pFVar3);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"culling",
             "Culling");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  for (frontOrderNdx = 0; frontOrderNdx < 3; frontOrderNdx = frontOrderNdx + 1) {
    for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
      for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < 2;
          name.field_2._12_4_ = name.field_2._12_4_ + 1) {
        pcVar4 = init::cullModes[frontOrderNdx].prefix;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a8,pcVar4,(allocator<char> *)((long)&interpolation + 7));
        std::operator+(&local_88,&local_a8,init::primitiveTypes[local_40].name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                       ,&local_88,init::frontOrders[(int)name.field_2._12_4_].postfix);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_a8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&interpolation + 7));
        this_01 = (CullingTest *)operator_new(0xa8);
        ctx_00 = (this->super_TestCaseGroup).m_context;
        pcVar4 = (char *)std::__cxx11::string::c_str();
        anon_unknown_1::CullingTest::CullingTest
                  (this_01,ctx_00,pcVar4,"Test primitive culling.",
                   init::cullModes[frontOrderNdx].mode,init::primitiveTypes[local_40].type,
                   init::frontOrders[(int)name.field_2._12_4_].mode);
        tcu::TestNode::addChild(pTVar1,(TestNode *)this_01);
        std::__cxx11::string::~string((string *)local_68);
      }
    }
  }
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "interpolation","Test interpolation");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Non-projective interpolation");
  tcu::TestNode::addChild(pTVar1,pTVar2);
  pTVar5 = (TriangleInterpolationTest *)operator_new(0xb0);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar5,(this->super_TestCaseGroup).m_context,"triangles",
             "Verify triangle interpolation",4,0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pTVar5);
  pTVar5 = (TriangleInterpolationTest *)operator_new(0xb0);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar5,(this->super_TestCaseGroup).m_context,"triangle_strip",
             "Verify triangle strip interpolation",5,0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pTVar5);
  pTVar5 = (TriangleInterpolationTest *)operator_new(0xb0);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar5,(this->super_TestCaseGroup).m_context,"triangle_fan",
             "Verify triangle fan interpolation",6,0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pTVar5);
  pLVar6 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar6,(this->super_TestCaseGroup).m_context,"lines","Verify line interpolation",1,0,
             1.0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar6);
  pLVar6 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar6,(this->super_TestCaseGroup).m_context,"line_strip",
             "Verify line strip interpolation",3,0,1.0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar6);
  pLVar6 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar6,(this->super_TestCaseGroup).m_context,"line_loop",
             "Verify line loop interpolation",2,0,1.0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar6);
  pLVar6 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar6,(this->super_TestCaseGroup).m_context,"lines_wide",
             "Verify wide line interpolation",1,0,5.0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar6);
  pLVar6 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar6,(this->super_TestCaseGroup).m_context,"line_strip_wide",
             "Verify wide line strip interpolation",3,0,5.0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar6);
  pLVar6 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar6,(this->super_TestCaseGroup).m_context,"line_loop_wide",
             "Verify wide line loop interpolation",2,0,5.0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar6);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"projected",
             "Projective interpolation");
  tcu::TestNode::addChild(pTVar1,pTVar2);
  pTVar5 = (TriangleInterpolationTest *)operator_new(0xb0);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar5,(this->super_TestCaseGroup).m_context,"triangles",
             "Verify triangle interpolation",4,2);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pTVar5);
  pTVar5 = (TriangleInterpolationTest *)operator_new(0xb0);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar5,(this->super_TestCaseGroup).m_context,"triangle_strip",
             "Verify triangle strip interpolation",5,2);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pTVar5);
  pTVar5 = (TriangleInterpolationTest *)operator_new(0xb0);
  anon_unknown_1::TriangleInterpolationTest::TriangleInterpolationTest
            (pTVar5,(this->super_TestCaseGroup).m_context,"triangle_fan",
             "Verify triangle fan interpolation",6,2);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pTVar5);
  pLVar6 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar6,(this->super_TestCaseGroup).m_context,"lines","Verify line interpolation",1,2,
             1.0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar6);
  pLVar6 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar6,(this->super_TestCaseGroup).m_context,"line_strip",
             "Verify line strip interpolation",3,2,1.0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar6);
  pLVar6 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar6,(this->super_TestCaseGroup).m_context,"line_loop",
             "Verify line loop interpolation",2,2,1.0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar6);
  pLVar6 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar6,(this->super_TestCaseGroup).m_context,"lines_wide",
             "Verify wide line interpolation",1,2,5.0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar6);
  pLVar6 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar6,(this->super_TestCaseGroup).m_context,"line_strip_wide",
             "Verify wide line strip interpolation",3,2,5.0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar6);
  pLVar6 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar6,(this->super_TestCaseGroup).m_context,"line_loop_wide",
             "Verify wide line loop interpolation",2,2,5.0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pLVar6);
  return extraout_EAX;
}

Assistant:

void RasterizationTests::init (void)
{
	// .primitives
	{
		tcu::TestCaseGroup* const primitives = new tcu::TestCaseGroup(m_testCtx, "primitives", "Primitive rasterization");

		addChild(primitives);

		primitives->addChild(new TrianglesCase		(m_context, "triangles",		"Render primitives as GL_TRIANGLES, verify rasterization result"));
		primitives->addChild(new TriangleStripCase	(m_context, "triangle_strip",	"Render primitives as GL_TRIANGLE_STRIP, verify rasterization result"));
		primitives->addChild(new TriangleFanCase	(m_context, "triangle_fan",		"Render primitives as GL_TRIANGLE_FAN, verify rasterization result"));
		primitives->addChild(new LinesCase			(m_context, "lines",			"Render primitives as GL_LINES, verify rasterization result",							PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new LineStripCase		(m_context, "line_strip",		"Render primitives as GL_LINE_STRIP, verify rasterization result",						PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new LineLoopCase		(m_context, "line_loop",		"Render primitives as GL_LINE_LOOP, verify rasterization result",						PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new LinesCase			(m_context, "lines_wide",		"Render primitives as GL_LINES with wide lines, verify rasterization result",			PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new LineStripCase		(m_context, "line_strip_wide",	"Render primitives as GL_LINE_STRIP with wide lines, verify rasterization result",		PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new LineLoopCase		(m_context, "line_loop_wide",	"Render primitives as GL_LINE_LOOP with wide lines, verify rasterization result",		PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new PointCase			(m_context, "points",			"Render primitives as GL_POINTS, verify rasterization result",							PRIMITIVEWIDENESS_WIDE));
	}

	// .fill_rules
	{
		tcu::TestCaseGroup* const fillRules = new tcu::TestCaseGroup(m_testCtx, "fill_rules", "Primitive fill rules");

		addChild(fillRules);

		fillRules->addChild(new FillRuleCase(m_context,	"basic_quad",			"Verify fill rules",	FillRuleCase::FILLRULECASE_BASIC));
		fillRules->addChild(new FillRuleCase(m_context,	"basic_quad_reverse",	"Verify fill rules",	FillRuleCase::FILLRULECASE_REVERSED));
		fillRules->addChild(new FillRuleCase(m_context,	"clipped_full",			"Verify fill rules",	FillRuleCase::FILLRULECASE_CLIPPED_FULL));
		fillRules->addChild(new FillRuleCase(m_context,	"clipped_partly",		"Verify fill rules",	FillRuleCase::FILLRULECASE_CLIPPED_PARTIAL));
		fillRules->addChild(new FillRuleCase(m_context,	"projected",			"Verify fill rules",	FillRuleCase::FILLRULECASE_PROJECTED));
	}

	// .culling
	{
		static const struct CullMode
		{
			glw::GLenum	mode;
			const char*	prefix;
		} cullModes[] =
		{
			{ GL_FRONT,				"front_"	},
			{ GL_BACK,				"back_"		},
			{ GL_FRONT_AND_BACK,	"both_"		},
		};
		static const struct PrimitiveType
		{
			glw::GLenum	type;
			const char*	name;
		} primitiveTypes[] =
		{
			{ GL_TRIANGLES,			"triangles"			},
			{ GL_TRIANGLE_STRIP,	"triangle_strip"	},
			{ GL_TRIANGLE_FAN,		"triangle_fan"		},
		};
		static const struct FrontFaceOrder
		{
			glw::GLenum	mode;
			const char*	postfix;
		} frontOrders[] =
		{
			{ GL_CCW,	""			},
			{ GL_CW,	"_reverse"	},
		};

		tcu::TestCaseGroup* const culling = new tcu::TestCaseGroup(m_testCtx, "culling", "Culling");

		addChild(culling);

		for (int cullModeNdx   = 0; cullModeNdx   < DE_LENGTH_OF_ARRAY(cullModes);      ++cullModeNdx)
		for (int primitiveNdx  = 0; primitiveNdx  < DE_LENGTH_OF_ARRAY(primitiveTypes); ++primitiveNdx)
		for (int frontOrderNdx = 0; frontOrderNdx < DE_LENGTH_OF_ARRAY(frontOrders);    ++frontOrderNdx)
		{
			const std::string name = std::string(cullModes[cullModeNdx].prefix) + primitiveTypes[primitiveNdx].name + frontOrders[frontOrderNdx].postfix;

			culling->addChild(new CullingTest(m_context, name.c_str(), "Test primitive culling.", cullModes[cullModeNdx].mode, primitiveTypes[primitiveNdx].type, frontOrders[frontOrderNdx].mode));
		}
	}

	// .interpolation
	{
		tcu::TestCaseGroup* const interpolation = new tcu::TestCaseGroup(m_testCtx, "interpolation", "Test interpolation");

		addChild(interpolation);

		// .basic
		{
			tcu::TestCaseGroup* const basic = new tcu::TestCaseGroup(m_testCtx, "basic", "Non-projective interpolation");

			interpolation->addChild(basic);

			basic->addChild(new TriangleInterpolationTest		(m_context, "triangles",		"Verify triangle interpolation",		GL_TRIANGLES,		INTERPOLATIONFLAGS_NONE));
			basic->addChild(new TriangleInterpolationTest		(m_context, "triangle_strip",	"Verify triangle strip interpolation",	GL_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_NONE));
			basic->addChild(new TriangleInterpolationTest		(m_context, "triangle_fan",		"Verify triangle fan interpolation",	GL_TRIANGLE_FAN,	INTERPOLATIONFLAGS_NONE));
			basic->addChild(new LineInterpolationTest			(m_context, "lines",			"Verify line interpolation",			GL_LINES,			INTERPOLATIONFLAGS_NONE,	1.0f));
			basic->addChild(new LineInterpolationTest			(m_context, "line_strip",		"Verify line strip interpolation",		GL_LINE_STRIP,		INTERPOLATIONFLAGS_NONE,	1.0f));
			basic->addChild(new LineInterpolationTest			(m_context, "line_loop",		"Verify line loop interpolation",		GL_LINE_LOOP,		INTERPOLATIONFLAGS_NONE,	1.0f));
			basic->addChild(new LineInterpolationTest			(m_context, "lines_wide",		"Verify wide line interpolation",		GL_LINES,			INTERPOLATIONFLAGS_NONE,	5.0f));
			basic->addChild(new LineInterpolationTest			(m_context, "line_strip_wide",	"Verify wide line strip interpolation",	GL_LINE_STRIP,		INTERPOLATIONFLAGS_NONE,	5.0f));
			basic->addChild(new LineInterpolationTest			(m_context, "line_loop_wide",	"Verify wide line loop interpolation",	GL_LINE_LOOP,		INTERPOLATIONFLAGS_NONE,	5.0f));
		}

		// .projected
		{
			tcu::TestCaseGroup* const projected = new tcu::TestCaseGroup(m_testCtx, "projected", "Projective interpolation");

			interpolation->addChild(projected);

			projected->addChild(new TriangleInterpolationTest	(m_context, "triangles",		"Verify triangle interpolation",		GL_TRIANGLES,		INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new TriangleInterpolationTest	(m_context, "triangle_strip",	"Verify triangle strip interpolation",	GL_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new TriangleInterpolationTest	(m_context, "triangle_fan",		"Verify triangle fan interpolation",	GL_TRIANGLE_FAN,	INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new LineInterpolationTest		(m_context, "lines",			"Verify line interpolation",			GL_LINES,			INTERPOLATIONFLAGS_PROJECTED,	1.0f));
			projected->addChild(new LineInterpolationTest		(m_context, "line_strip",		"Verify line strip interpolation",		GL_LINE_STRIP,		INTERPOLATIONFLAGS_PROJECTED,	1.0f));
			projected->addChild(new LineInterpolationTest		(m_context, "line_loop",		"Verify line loop interpolation",		GL_LINE_LOOP,		INTERPOLATIONFLAGS_PROJECTED,	1.0f));
			projected->addChild(new LineInterpolationTest		(m_context, "lines_wide",		"Verify wide line interpolation",		GL_LINES,			INTERPOLATIONFLAGS_PROJECTED,	5.0f));
			projected->addChild(new LineInterpolationTest		(m_context, "line_strip_wide",	"Verify wide line strip interpolation",	GL_LINE_STRIP,		INTERPOLATIONFLAGS_PROJECTED,	5.0f));
			projected->addChild(new LineInterpolationTest		(m_context, "line_loop_wide",	"Verify wide line loop interpolation",	GL_LINE_LOOP,		INTERPOLATIONFLAGS_PROJECTED,	5.0f));
		}
	}
}